

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_brent.c
# Opt level: O0

double xc_math_brent(xc_brent_f *f,double lower_bound,double upper_bound,double TOL,double MAX_ITER,
                    void *f_params)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  undefined8 in_RSI;
  code *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  int iter;
  int mflag;
  double d;
  double s;
  double fc;
  double c;
  double tmp;
  double fs;
  double fb;
  double fa;
  double b;
  double a;
  int local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  dVar1 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  local_50 = (double)(*in_RDI)(in_XMM0_Qa,in_RSI);
  dVar4 = (double)(*in_RDI)(in_XMM1_Qa,in_RSI);
  if (0.0 < local_50 * dVar4) {
    fprintf(_stderr,"Brent: bracketing error [%lf,%lf]\n",in_XMM0_Qa,in_XMM1_Qa);
    exit(1);
  }
  local_58 = dVar4;
  local_48 = in_XMM1_Qa;
  local_40 = in_XMM0_Qa;
  if (ABS(local_50) < ABS(dVar4)) {
    local_58 = local_50;
    local_50 = dVar4;
    local_48 = in_XMM0_Qa;
    local_40 = in_XMM1_Qa;
  }
  local_70 = local_40;
  local_78 = local_50;
  bVar2 = true;
  local_88 = 0.0;
  for (local_90 = 1; (double)local_90 < in_XMM3_Qa; local_90 = local_90 + 1) {
    if (ABS(local_48 - local_40) < dVar1) goto LAB_01af16dc;
    if ((local_50 != local_78) || (NAN(local_50) || NAN(local_78))) {
      if ((local_58 == local_78) && (!NAN(local_58) && !NAN(local_78))) goto LAB_01af1405;
      local_80 = (local_40 * local_58 * local_78) / ((local_50 - local_58) * (local_50 - local_78))
                 + (local_48 * local_50 * local_78) /
                   ((local_58 - local_50) * (local_58 - local_78)) +
                 (local_70 * local_50 * local_58) / ((local_78 - local_50) * (local_78 - local_58));
    }
    else {
LAB_01af1405:
      local_80 = local_48 - (local_58 * (local_48 - local_40)) / (local_58 - local_50);
    }
    if ((((((local_80 < (local_40 * 3.0 + local_48) * 0.25) || (local_48 < local_80)) ||
          ((bVar2 && (ABS(local_48 - local_70) * 0.5 <= ABS(local_80 - local_48))))) ||
         ((!bVar2 && (ABS(local_70 - local_88) * 0.5 <= ABS(local_80 - local_48))))) ||
        ((bVar2 && (ABS(local_48 - local_70) < dVar1)))) ||
       ((!bVar2 && (ABS(local_70 - local_88) < dVar1)))) {
      local_80 = (local_40 + local_48) * 0.5;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    dVar4 = (double)(*in_RDI)(local_80,in_RSI);
    local_88 = local_70;
    local_70 = local_48;
    local_78 = local_58;
    if (0.0 <= local_50 * dVar4) {
      local_40 = local_80;
      local_50 = dVar4;
    }
    else {
      local_48 = local_80;
      local_58 = dVar4;
    }
    dVar3 = local_40;
    dVar4 = local_50;
    if (ABS(local_50) < ABS(local_58)) {
      local_40 = local_48;
      local_48 = dVar3;
      local_50 = local_58;
      local_58 = dVar4;
    }
  }
  fprintf(_stderr,"Warning: Convergence not reached in brent\n");
LAB_01af16dc:
  local_8 = (local_48 + local_40) / 2.0;
  return local_8;
}

Assistant:

GPU_FUNCTION
double xc_math_brent
(xc_brent_f f,
 double lower_bound, double upper_bound,
 double TOL, double MAX_ITER,
 void *f_params)
{
  double a, b, fa, fb, fs;
  double tmp;
  double c, fc, s, d;
  int mflag, iter;

  a = lower_bound;
  b = upper_bound;
  fa = f(a, f_params);
  fb = f(b, f_params);
  fs = 0;

  if (fa * fb > 0){
#ifndef HAVE_CUDA
    fprintf(stderr, "Brent: bracketing error [%lf,%lf]\n", a, b);
    exit(1);
#endif
  }

  if (fabs(fa) < fabs(fb)){
    tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
    tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
  }

  c = a;     /* c now equals the largest magnitude of the lower and upper bounds */
  fc = fa;   /* precompute function evalutation for point c by assigning it the same value as fa */
  mflag = 1; /* boolean flag used to evaluate if statement later on */
  s = 0;     /* Our root that will be returned */
  d = 0;     /* Only used if mflag is unset (mflag == false) */

  for (iter=1; iter<MAX_ITER; ++iter){
    /* stop if converged or error is less than tolerance */
    if (fabs(b - a) < TOL)
      return (b + a)/2.0;

    if (fa != fc && fb != fc){
      /* use inverse quadratic interopolation */
      s = ( a * fb * fc / ((fa - fb) * (fa - fc)) )
        + ( b * fa * fc / ((fb - fa) * (fb - fc)) )
        + ( c * fa * fb / ((fc - fa) * (fc - fb)) );
    }else{
      /* secant method */
      s = b - fb * (b - a) / (fb - fa);
    }

    /*
      (condition 1) s is not between  (3a+b)/4  and b or
      (condition 2) (mflag is true and |s−b| ≥ |b−c|/2) or
      (condition 3) (mflag is false and |s−b| ≥ |c−d|/2) or
      (condition 4) (mflag is set and |b−c| < |TOL|) or
      (condition 5) (mflag is false and |c−d| < |TOL|)
        */
    if(((s < (3 * a + b) * 0.25) || (s > b) ) ||
       (  mflag && (fabs(s-b) >= (fabs(b-c) * 0.5))) ||
       ( !mflag && (fabs(s-b) >= (fabs(c-d) * 0.5))) ||
       (  mflag && (fabs(b-c) < TOL)) ||
       ( !mflag && (fabs(c-d) < TOL))){
      /* bisection */
      s = (a+b)*0.5;
      mflag = 1;
    }else
      mflag = 0;

    fs = f(s, f_params);
    d = c;
    c = b;
    fc = fb;

    if (fa*fs < 0){
      b = s;
      fb = fs;
    }else{
      a = s;
      fa = fs;
    }

    if (fabs(fa) < fabs(fb)){
      tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
      tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
    }

  }

#ifndef HAVE_CUDA
  fprintf(stderr, "Warning: Convergence not reached in brent\n");
#endif

  return (b + a)/2.0;

}